

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absIter.c
# Opt level: O2

Gia_Man_t *
Gia_ManShrinkGla(Gia_Man_t *p,int nFrameMax,int nTimeOut,int fUsePdr,int fUseSat,int fUseBdd,
                int fVerbose)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  abctime aVar8;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar9;
  abctime aVar10;
  Vec_Int_t *pVVar11;
  abctime aVar12;
  ulong uVar13;
  abctime time;
  abctime time_00;
  int v;
  ulong uVar14;
  char *pcVar15;
  uint local_64;
  uint local_5c;
  
  aVar8 = Abc_Clock();
  if (p->vCos->nSize - p->nRegs == 1) {
    if (p->vGateClasses != (Vec_Int_t *)0x0) {
      p_00 = Vec_IntDup(p->vGateClasses);
      if (nFrameMax == 0) {
        iVar4 = Gia_IterTryImprove(p,0,0);
      }
      else {
        iVar4 = nFrameMax + -1;
      }
      local_5c = 0;
      local_64 = 0;
      uVar13 = 1;
      bVar2 = false;
LAB_004f086a:
      do {
        v = (int)uVar13;
        if (v < p->nObjs) {
          pObj = Gia_ManObj(p,v);
          if (pObj != (Gia_Obj_t *)0x0) {
            if ((pObj->field_0x3 & 0x40) == 0) {
              iVar5 = Gia_ObjIsInGla(p,pObj);
              if (iVar5 != 0) {
                if (p->vCos->nSize <= p->nRegs) {
                  __assert_fail("v < Gia_ManPoNum(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
                }
                pGVar9 = Gia_ManCo(p,0);
                if (pObj != pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff)) {
                  uVar14 = *(ulong *)pObj & 0x1fffffff;
                  if (uVar14 != 0x1fffffff && -1 < (int)*(ulong *)pObj) {
                    iVar5 = Gia_ObjIsInGla(p,pObj + -uVar14);
                    if (iVar5 != 0) {
                      iVar5 = Gia_ObjIsInGla(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 &
                                                              0x1fffffff));
                      if (iVar5 != 0) goto LAB_004f0b13;
                    }
                  }
                  iVar5 = Gia_ObjIsRo(p,pObj);
                  if (iVar5 != 0) {
                    iVar5 = Gia_ObjIsRo(p,pObj);
                    if (iVar5 == 0) {
                      __assert_fail("Gia_ObjIsRo(p, pObj)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                    ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                    }
                    iVar5 = p->vCos->nSize;
                    iVar1 = p->vCis->nSize;
                    iVar6 = Gia_ObjCioId(pObj);
                    pGVar9 = Gia_ManCo(p,(iVar5 - iVar1) + iVar6);
                    iVar5 = Gia_ObjIsInGla(p,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 &
                                                              0x1fffffff));
                    if (iVar5 != 0) goto LAB_004f0b13;
                  }
                  aVar12 = Abc_Clock();
                  printf("%5d : ",(ulong)local_64);
                  printf("Obj =%7d   ",uVar13);
                  pVVar11 = p->vGateClasses;
                  iVar5 = Gia_ObjId(p,pObj);
                  Vec_IntWriteEntry(pVVar11,iVar5,0);
                  uVar7 = Gia_IterTryImprove(p,nTimeOut,iVar4);
                  if (nFrameMax == 0) {
                    if (iVar4 < (int)uVar7) {
                      pcVar15 = "iFrame <= iFrame0";
                      uVar7 = 0x6e;
                      goto LAB_004f0bee;
                    }
                  }
                  else if (nFrameMax < (int)uVar7) {
                    pcVar15 = "iFrame <= nFrameMax";
                    uVar7 = 0x6c;
                    goto LAB_004f0bee;
                  }
                  printf("Frame =%6d   ",(ulong)uVar7);
                  if ((int)uVar7 < iVar4) {
                    pObj->field_0x3 = pObj->field_0x3 | 0x40;
                    pVVar11 = p->vGateClasses;
                    uVar7 = Gia_ObjId(p,pObj);
                    pcVar15 = (char *)(ulong)uVar7;
                    Vec_IntWriteEntry(pVVar11,uVar7,1);
                    printf("           ");
                  }
                  else {
                    local_5c = local_5c + 1;
                    printf("Removing   ");
                    uVar7 = Gia_ObjId(p,pObj);
                    pcVar15 = (char *)(ulong)uVar7;
                    Vec_IntWriteEntry(p_00,uVar7,0);
                    bVar2 = true;
                  }
                  aVar10 = Abc_Clock();
                  Abc_PrintTime((int)aVar10 - (int)aVar12,pcVar15,time);
                  pVVar11 = p->vGateClasses;
                  if (pVVar11 != (Vec_Int_t *)0x0) {
                    if (pVVar11->pArray != (int *)0x0) {
                      free(pVVar11->pArray);
                      p->vGateClasses->pArray = (int *)0x0;
                      pVVar11 = p->vGateClasses;
                      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_004f0afe;
                    }
                    free(pVVar11);
                    p->vGateClasses = (Vec_Int_t *)0x0;
                  }
LAB_004f0afe:
                  local_64 = local_64 + 1;
                  pVVar11 = Vec_IntDup(p_00);
                  p->vGateClasses = pVVar11;
                }
              }
            }
LAB_004f0b13:
            uVar13 = (ulong)(v + 1);
            goto LAB_004f086a;
          }
        }
        uVar13 = 1;
        bVar3 = !bVar2;
        bVar2 = false;
        if (bVar3) {
          Gia_ManCleanMark0(p);
          free(p_00->pArray);
          free(p_00);
          uVar14 = 0;
          printf("Tried = %d.  ",(ulong)local_64);
          uVar7 = p->vGateClasses->nSize;
          uVar13 = (ulong)uVar7;
          if ((int)uVar7 < 1) {
            uVar13 = uVar14;
          }
          iVar4 = 0;
          for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
            iVar4 = iVar4 + (uint)(0 < p->vGateClasses->pArray[uVar14]);
          }
          pcVar15 = (char *)(ulong)local_5c;
          printf("Removed = %d. (%.2f %%)  ",((double)(int)local_5c * 100.0) / (double)iVar4);
          aVar12 = Abc_Clock();
          Abc_PrintTime((int)aVar12 - (int)aVar8,pcVar15,time_00);
          return (Gia_Man_t *)0x0;
        }
      } while( true );
    }
    pcVar15 = "p->vGateClasses != NULL";
    uVar7 = 0x4b;
  }
  else {
    pcVar15 = "Gia_ManPoNum(p) == 1";
    uVar7 = 0x4a;
  }
LAB_004f0bee:
  __assert_fail(pcVar15,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                ,uVar7,"Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManShrinkGla( Gia_Man_t * p, int nFrameMax, int nTimeOut, int fUsePdr, int fUseSat, int fUseBdd, int fVerbose )
{
    Gia_Obj_t * pObj;
    int i, iFrame0, iFrame;
    int nTotal = 0, nRemoved = 0;
    Vec_Int_t * vGScopy;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManPoNum(p) == 1 );
    assert( p->vGateClasses != NULL );
    vGScopy = Vec_IntDup( p->vGateClasses );
    if ( nFrameMax == 0 )
        iFrame0 = Gia_IterTryImprove( p, 0, 0 );
    else
        iFrame0 = nFrameMax - 1;
    while ( 1 )
    {
        int fChanges = 0;
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( pObj->fMark0 )
                continue;
            if ( !Gia_ObjIsInGla(p, pObj) )
                continue;
            if ( pObj == Gia_ObjFanin0( Gia_ManPo(p, 0) ) )
                continue;
            if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Gia_ObjIsInGla(p, Gia_ObjFanin0(pObj)) && Gia_ObjIsInGla(p, Gia_ObjFanin1(pObj)) )
                    continue;
            }
            if ( Gia_ObjIsRo(p, pObj) )
            {
                if ( Gia_ObjIsInGla(p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj))) )
                    continue;
            }        
            clk = Abc_Clock();
            printf( "%5d : ", nTotal );
            printf( "Obj =%7d   ", i );
            Gia_ObjRemFromGla( p, pObj );
            iFrame = Gia_IterTryImprove( p, nTimeOut, iFrame0 );
            if ( nFrameMax )
                assert( iFrame <= nFrameMax );
            else
                assert( iFrame <= iFrame0 );
            printf( "Frame =%6d   ", iFrame );
            if ( iFrame < iFrame0 )
            {
                pObj->fMark0 = 1;
                Gia_ObjAddToGla( p, pObj );
                printf( "           " );
            }
            else
            {
                fChanges = 1;
                nRemoved++;
                printf( "Removing   " );
                Vec_IntWriteEntry( vGScopy, Gia_ObjId(p, pObj), 0 );
            }
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            nTotal++;
            // update the classes
            Vec_IntFreeP( &p->vGateClasses );
            p->vGateClasses = Vec_IntDup(vGScopy);
        }
        if ( !fChanges )
            break;
    }
    Gia_ManCleanMark0(p);
    Vec_IntFree( vGScopy );
    printf( "Tried = %d.  ",     nTotal );
    printf( "Removed = %d. (%.2f %%)  ",  nRemoved, 100.0 * nRemoved / Vec_IntCountPositive(p->vGateClasses) );
    Abc_PrintTime( 1, "Time",  Abc_Clock() - clkTotal );
    return NULL;
}